

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBufferDescriptor.h
# Opt level: O1

void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(int32_t termLength)

{
  long *plVar1;
  SourcedException *pSVar2;
  char *pcVar3;
  size_type *psVar4;
  allocator local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (termLength < 0x10000) {
    pSVar2 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_c8,0x10000);
    std::operator+(&local_e8,"term length less than min size of ",&local_c8);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)*plVar1;
    psVar4 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_108._M_dataplus._M_p == psVar4) {
      local_108.field_2._M_allocated_capacity = *psVar4;
      local_108.field_2._8_8_ = plVar1[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar4;
    }
    local_108._M_string_length = plVar1[1];
    *plVar1 = (long)psVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::to_string(&local_68,termLength);
    std::operator+(&local_a8,&local_108,&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,"");
    pcVar3 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                              );
    std::__cxx11::string::string((string *)&local_48,pcVar3,&local_109);
    util::SourcedException::SourcedException(pSVar2,&local_a8,&local_88,&local_48,0x9c);
    *(undefined ***)pSVar2 = &PTR__SourcedException_001886b0;
    __cxa_throw(pSVar2,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if (termLength < 0x40000001) {
    if ((termLength + 0x7fffffffU & termLength) == 0) {
      return;
    }
    pSVar2 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_108,termLength);
    std::operator+(&local_a8,"term length not a power of 2, length=",&local_108);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,"");
    pcVar3 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                              );
    std::__cxx11::string::string((string *)&local_c8,pcVar3,(allocator *)&local_68);
    util::SourcedException::SourcedException(pSVar2,&local_a8,&local_e8,&local_c8,0xa9);
    *(undefined ***)pSVar2 = &PTR__SourcedException_001886b0;
    __cxa_throw(pSVar2,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  pSVar2 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_c8,0x40000000);
  std::operator+(&local_e8,"term length greater than max size of ",&local_c8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_108._M_dataplus._M_p = (pointer)*plVar1;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar4) {
    local_108.field_2._M_allocated_capacity = *psVar4;
    local_108.field_2._8_8_ = plVar1[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar4;
  }
  local_108._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_68,termLength);
  std::operator+(&local_a8,&local_108,&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
             ,"");
  pcVar3 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_48,pcVar3,&local_109);
  util::SourcedException::SourcedException(pSVar2,&local_a8,&local_88,&local_48,0xa3);
  *(undefined ***)pSVar2 = &PTR__SourcedException_001886b0;
  __cxa_throw(pSVar2,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkTermLength(std::int32_t termLength)
{
    if (termLength < TERM_MIN_LENGTH)
    {
        throw util::IllegalStateException(
            "term length less than min size of " + std::to_string(TERM_MIN_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (termLength > TERM_MAX_LENGTH)
    {
        throw util::IllegalStateException(
            "term length greater than max size of " + std::to_string(TERM_MAX_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (!util::BitUtil::isPowerOfTwo(termLength))
    {
        throw util::IllegalStateException(
            "term length not a power of 2, length=" + std::to_string(termLength), SOURCEINFO);
    }
}